

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O3

void __thiscall HRSS_NoWritesToConstData_Test::TestBody(HRSS_NoWritesToConstData_Test *this)

{
  int iVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar2;
  char *in_R9;
  pointer *__ptr;
  uint8_t shared_key [32];
  uint8_t ciphertext [1138];
  uint8_t encap_entropy [1400];
  HRSS_private_key priv;
  HRSS_public_key pub;
  HRSS_public_key pub_orig;
  HRSS_private_key priv_orig;
  uint8_t generate_key_entropy [1432];
  AssertHelper local_2958;
  Message local_2950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2948;
  AssertHelper local_2940;
  undefined1 local_2938 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2928;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2918 [4];
  internal local_28f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28f0 [143];
  string local_2478 [44];
  HRSS_private_key local_1ef8;
  HRSS_public_key local_17e8;
  undefined1 local_1258 [1424];
  undefined1 local_cc8 [1808];
  uchar local_5b8 [1440];
  
  RAND_bytes(local_5b8,0x598);
  memset(&local_17e8,0xa3,0x590);
  memset(&local_1ef8,0x3a,0x710);
  iVar1 = HRSS_generate_key(&local_17e8,&local_1ef8,local_5b8);
  local_28f8[0] = (internal)(iVar1 != 0);
  local_28f0[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)local_2918);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_28f0;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_2478,local_28f8,
               (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2938,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0xd6,local_2478[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2938,(Message *)local_2918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2478[0]._M_dataplus._M_p != &local_2478[0].field_2) {
      operator_delete(local_2478[0]._M_dataplus._M_p,local_2478[0].field_2._M_allocated_capacity + 1
                     );
    }
    local_2930 = local_28f0[0];
    if (local_2918[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_2918[0]._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
      local_2930 = local_28f0[0];
    }
  }
  else {
    memcpy(local_cc8,&local_1ef8,0x710);
    memcpy(local_1258,&local_17e8,0x590);
    RAND_bytes((uchar *)local_2478,0x578);
    iVar1 = HRSS_encap((uint8_t *)local_28f8,(uint8_t *)local_2918,&local_17e8,(uint8_t *)local_2478
                      );
    local_2950.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_2950.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,iVar1 != 0);
    local_2948 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      local_2950.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = memcmp(&local_17e8,local_1258,0x590);
      local_2958.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_2938,"OPENSSL_memcmp(&pub, &pub_orig, sizeof(pub))","0",
                 (int *)&local_2950,(int *)&local_2958);
      if (local_2938[0] == (internal)0x0) {
        testing::Message::Message(&local_2950);
        if (local_2930 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_2930->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_2958,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xe0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2958,&local_2950);
LAB_0030afcb:
        testing::internal::AssertHelper::~AssertHelper(&local_2958);
        if ((long *)CONCAT44(local_2950.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (int)local_2950.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_2950.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (int)local_2950.ss_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl) + 8))();
        }
      }
      else {
        if (local_2930 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_2930,local_2930);
        }
        iVar1 = HRSS_decap((uint8_t *)local_2918,&local_1ef8,(uint8_t *)local_28f8,0x472);
        local_2950.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_2950.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,iVar1 != 0);
        local_2948 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_2958);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_2938,(internal *)&local_2950,
                     (AssertionResult *)
                     "HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext))","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2940,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                     ,0xe2,(char *)CONCAT71(local_2938._1_7_,local_2938[0]));
          testing::internal::AssertHelper::operator=(&local_2940,(Message *)&local_2958);
          goto LAB_0030af25;
        }
        local_2950.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = memcmp(&local_1ef8,local_cc8,0x710);
        local_2958.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_2938,"OPENSSL_memcmp(&priv, &priv_orig, sizeof(priv))","0",
                   (int *)&local_2950,(int *)&local_2958);
        if (local_2938[0] == (internal)0x0) {
          testing::Message::Message(&local_2950);
          if (local_2930 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            pcVar2 = "";
          }
          else {
            pcVar2 = (local_2930->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2958,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                     ,0xe4,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2958,&local_2950);
          goto LAB_0030afcb;
        }
      }
      if (local_2930 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_2930;
      goto LAB_0030aff2;
    }
    testing::Message::Message((Message *)&local_2958);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2938,(internal *)&local_2950,
               (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub, encap_entropy)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2940,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0xde,(char *)CONCAT71(local_2938._1_7_,local_2938[0]));
    testing::internal::AssertHelper::operator=(&local_2940,(Message *)&local_2958);
LAB_0030af25:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2948;
    testing::internal::AssertHelper::~AssertHelper(&local_2940);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2938._1_7_,local_2938[0]) != &local_2928) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_2938._1_7_,local_2938[0]),
                      local_2928._M_allocated_capacity + 1);
    }
    local_2930 = local_2948;
    if ((long *)CONCAT44(local_2958.data_._4_4_,local_2958.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2958.data_._4_4_,local_2958.data_._0_4_) + 8))();
      local_2930 = local_2948;
    }
  }
  if (local_2930 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
LAB_0030aff2:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_2930);
  return;
}

Assistant:

TEST(HRSS, NoWritesToConstData) {
  // Normalisation of some polynomials used to write into the generated keys.
  // This is fine in a purely ephemeral setting, but triggers TSAN warnings in
  // more complex ones.
  uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
  RAND_bytes(generate_key_entropy, sizeof(generate_key_entropy));
  HRSS_public_key pub, pub_orig;
  HRSS_private_key priv, priv_orig;
  OPENSSL_memset(&pub, 0xa3, sizeof(pub));
  OPENSSL_memset(&priv, 0x3a, sizeof(priv));
  ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));
  OPENSSL_memcpy(&priv_orig, &priv, sizeof(priv));
  OPENSSL_memcpy(&pub_orig, &pub, sizeof(pub));

  uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
  uint8_t shared_key[HRSS_KEY_BYTES];
  uint8_t encap_entropy[HRSS_ENCAP_BYTES];
  RAND_bytes(encap_entropy, sizeof(encap_entropy));
  ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub, encap_entropy));

  ASSERT_EQ(OPENSSL_memcmp(&pub, &pub_orig, sizeof(pub)), 0);

  ASSERT_TRUE(HRSS_decap(shared_key, &priv, ciphertext, sizeof(ciphertext)));

  ASSERT_EQ(OPENSSL_memcmp(&priv, &priv_orig, sizeof(priv)), 0);
}